

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_get_defined_func(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  SyHashEntry_Pr *pSVar1;
  int iVar2;
  jx9_value *pSrc;
  uint uVar3;
  jx9_vm *pjVar4;
  SyHashEntry_Pr **ppSVar5;
  
  pSrc = jx9_context_new_array(pCtx);
  if (pSrc == (jx9_value *)0x0) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pjVar4 = pCtx->pVm;
    if ((pjVar4->hHostFunction).nEntry != 0) {
      ppSVar5 = &(pjVar4->hHostFunction).pList;
      uVar3 = 0;
      do {
        pSVar1 = *ppSVar5;
        iVar2 = VmHashFuncStep((SyHashEntry *)pSVar1,pSrc);
        if (iVar2 != 0) break;
        ppSVar5 = &pSVar1->pNext;
        uVar3 = uVar3 + 1;
      } while (uVar3 < (pjVar4->hHostFunction).nEntry);
      pjVar4 = pCtx->pVm;
    }
    if ((pjVar4->hFunction).nEntry != 0) {
      ppSVar5 = &(pjVar4->hFunction).pList;
      uVar3 = 0;
      do {
        pSVar1 = *ppSVar5;
        iVar2 = VmHashFuncStep((SyHashEntry *)pSVar1,pSrc);
        if (iVar2 != 0) break;
        ppSVar5 = &pSVar1->pNext;
        uVar3 = uVar3 + 1;
      } while (uVar3 < (pjVar4->hFunction).nEntry);
    }
    jx9MemObjStore(pSrc,pCtx->pRet);
  }
  return 0;
}

Assistant:

static int vm_builtin_get_defined_func(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray;
	/* NOTE:
	 * Don't worry about freeing memory here, every allocated resource will be released
	 * automatically by the engine as soon we return from this foreign function.
	 */
	pArray = jx9_context_new_array(pCtx);
 	if( pArray == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* Return NULL */
		jx9_result_null(pCtx);
		return SXRET_OK;
	}
	/* Fill with the appropriate information */
	SyHashForEach(&pCtx->pVm->hHostFunction,VmHashFuncStep,pArray);
	/* Fill with the appropriate information */
	SyHashForEach(&pCtx->pVm->hFunction, VmHashFuncStep,pArray);
	/* Return a copy of the array array */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}